

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_lantern_handling.hpp
# Opt level: O2

uint32_t PatchImproveLanternHandling::inject_func_dim_palettes(ROM *rom,uint32_t func_and_words)

{
  uint32_t uVar1;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<md::DataRegister> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  allocator_type local_102;
  allocator_type local_101;
  string local_100;
  _Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_e0;
  AddressRegister local_c8;
  DataRegister local_b8;
  Code func;
  
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8.super_Register._code = '\x01';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  __l._M_len = 1;
  __l._M_array = &local_b8;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_100,__l,
             &local_101);
  local_c8.super_Register._code = '\0';
  local_c8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  __l_00._M_len = 1;
  __l_00._M_array = &local_c8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_e0,__l_00,
             &local_102);
  md::Code::movem_to_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_100,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_e0);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_e0);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base
            ((_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_100);
  local_100._M_string_length._0_1_ = 0;
  local_100._M_dataplus._M_p = (pointer)&PTR_getXn_00246bf0;
  md::Code::movew(&func,0xccc,(Param *)&local_100);
  local_100._M_string_length._0_1_ = 0;
  local_100._M_dataplus._M_p = (pointer)&PTR_getXn_00246c60;
  md::Code::lea(&func,0xff0080,(AddressRegister *)&local_100);
  local_100._M_string_length._0_1_ = 1;
  local_100._M_dataplus._M_p = (pointer)&PTR_getXn_00246bf0;
  md::Code::movew(&func,0x10,(Param *)&local_100);
  md::Code::jsr(&func,func_and_words);
  local_b8.super_Register._code = '\x01';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  __l_01._M_len = 1;
  __l_01._M_array = &local_b8;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_100,__l_01,
             &local_101);
  local_c8.super_Register._code = '\0';
  local_c8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  __l_02._M_len = 1;
  __l_02._M_array = &local_c8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_e0,__l_02,
             &local_102);
  md::Code::movem_from_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_100,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_e0);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_e0);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base
            ((_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_100);
  md::Code::rts(&func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"",(allocator<char> *)&local_e0);
  uVar1 = md::ROM::inject_code(rom,&func,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  md::Code::~Code(&func);
  return uVar1;
}

Assistant:

static uint32_t inject_func_dim_palettes(md::ROM& rom, uint32_t func_and_words)
    {
        // Darken palettes with AND filter contained in D0
        md::Code func;
        func.movem_to_stack({ reg_D1 }, { reg_A0 });
        {
            // Slightly dim palette 0
            func.movew(0x0CCC, reg_D0);
            func.lea(0xFF0080, reg_A0);
            func.movew(16, reg_D1);
            func.jsr(func_and_words);
        }
        func.movem_from_stack({ reg_D1 }, { reg_A0 });
        func.rts();
        return rom.inject_code(func);
    }